

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::eval_selection_uvec2(ShaderEvalContext *c)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(c->in[2].m_data + 1);
  uVar1 = (uint)(0.0 < c->in[0].m_data[2]);
  auVar7._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar7._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)c->in[1].m_data & auVar7._0_8_;
  auVar2 = ~auVar7 & auVar4 | auVar2;
  auVar6._0_4_ = (int)auVar2._0_4_;
  auVar6._4_4_ = (int)auVar2._4_4_;
  auVar6._8_4_ = (int)auVar2._8_4_;
  auVar3._0_4_ = auVar6._0_4_ >> 0x1f;
  auVar3._4_4_ = auVar6._4_4_ >> 0x1f;
  auVar3._8_4_ = auVar6._8_4_ >> 0x1f;
  auVar5._0_4_ = (int)(auVar2._0_4_ - 2.1474836e+09);
  auVar5._4_4_ = (int)(auVar2._4_4_ - 2.1474836e+09);
  auVar5._8_4_ = (int)(auVar2._8_4_ - 2.1474836e+09);
  auVar6 = auVar5 & auVar3 | auVar6;
  auVar8._0_8_ = auVar6._0_8_ & 0xffffffff;
  auVar8._8_4_ = auVar6._4_4_;
  auVar8._12_4_ = 0;
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(SUB168(auVar8 | _DAT_00ae4630,0) - (double)DAT_00ae4630),
                (float)(SUB168(auVar8 | _DAT_00ae4630,8) - DAT_00ae4630._8_8_));
  return;
}

Assistant:

void eval_selection_uvec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asUint(),			c.in[2].swizzle(2, 1).asUint()).asFloat(); }